

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O3

int run_test_tcp_bind6_localhost_ok(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  sockaddr_in6 addr;
  uv_tcp_t server;
  sockaddr_in6 local_124;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_tcp_bind6_localhost_ok_cold_5();
    return 1;
  }
  puVar2 = (uv_loop_t *)0x199c19;
  iVar1 = uv_ip6_addr("::1",0x23a3,&local_124);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)&stack0xfffffffffffffef8);
    if (iVar1 != 0) goto LAB_0016e673;
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffef8;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar2,(sockaddr *)&local_124,0);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016e67d;
    }
  }
  else {
    run_test_tcp_bind6_localhost_ok_cold_1();
LAB_0016e673:
    run_test_tcp_bind6_localhost_ok_cold_2();
  }
  run_test_tcp_bind6_localhost_ok_cold_3();
LAB_0016e67d:
  run_test_tcp_bind6_localhost_ok_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind6_localhost_ok) {
  struct sockaddr_in6 addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}